

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

int sndio_stream_init(cubeb_conflict2 *context,cubeb_stream_conflict2 **stream,char *stream_name,
                     cubeb_devid input_device,cubeb_stream_params *input_stream_params,
                     cubeb_devid output_device,cubeb_stream_params *output_stream_params,
                     uint latency_frames,cubeb_data_callback_conflict2 data_callback,
                     cubeb_state_callback_conflict2 state_callback,void *user_ptr)

{
  cubeb_sample_format cVar1;
  uint32_t uVar2;
  _func_sio_hdl_ptr_char_ptr_uint_int *p_Var3;
  int iVar4;
  cubeb_stream_conflict2 *__ptr;
  cubeb_stream_params *pcVar5;
  char *pcVar6;
  sio_hdl *psVar7;
  uchar *puVar8;
  uint uVar9;
  ulong uVar10;
  sio_par rpar;
  sio_par wpar;
  
  __ptr = (cubeb_stream_conflict2 *)calloc(1,0xa8);
  if (__ptr == (cubeb_stream_conflict2 *)0x0) {
    return -1;
  }
  if (input_stream_params == (cubeb_stream_params *)0x0) {
    if (output_stream_params == (cubeb_stream_params *)0x0) goto LAB_001218f1;
    uVar9 = 1;
LAB_0012169d:
    if ((output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_001218f1;
    __ptr->mode = uVar9;
    pcVar5 = output_stream_params;
  }
  else {
    if ((input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) != CUBEB_STREAM_PREF_NONE)
    goto LAB_001218f1;
    __ptr->mode = 2;
    if (output_stream_params != (cubeb_stream_params *)0x0) {
      uVar9 = 3;
      goto LAB_0012169d;
    }
    uVar9 = 2;
    pcVar5 = input_stream_params;
  }
  cVar1 = pcVar5->format;
  uVar2 = pcVar5->rate;
  __ptr->context = context;
  p_Var3 = cubeb_sio_open;
  pcVar6 = sndio_get_device();
  psVar7 = (*p_Var3)(pcVar6,uVar9,1);
  __ptr->hdl = psVar7;
  if (psVar7 != (sio_hdl *)0x0) {
    (*cubeb_sio_initpar)(&wpar);
    wpar.sig = 1;
    wpar.bits = 0x10;
    if (cVar1 < CUBEB_SAMPLE_FLOAT32BE) {
      wpar.le = *(uint *)(&DAT_0013647c + (ulong)cVar1 * 4);
      if ((uVar9 & 2) != 0) {
        wpar.rchan = input_stream_params->channels;
      }
      if ((uVar9 & 1) != 0) {
        wpar.pchan = output_stream_params->channels;
      }
      wpar.appbufsz = latency_frames;
      wpar.rate = uVar2;
      iVar4 = (*cubeb_sio_setpar)(psVar7,&wpar);
      if ((((((iVar4 != 0) && (iVar4 = (*cubeb_sio_getpar)(psVar7,&rpar), iVar4 != 0)) &&
            (rpar.bits == wpar.bits)) && ((rpar.le == wpar.le && (rpar.sig == wpar.sig)))) &&
          ((rpar.rate == wpar.rate && (((uVar9 & 2) == 0 || (rpar.rchan == wpar.rchan)))))) &&
         (((uVar9 & 1) == 0 || (rpar.pchan == wpar.pchan)))) {
        (*cubeb_sio_onmove)(psVar7,sndio_onmove,__ptr);
        __ptr->active = 0;
        __ptr->nfr = rpar.round;
        __ptr->rbpf = rpar.rchan * rpar.bps;
        __ptr->pbpf = rpar.pchan * rpar.bps;
        __ptr->rchan = rpar.rchan;
        __ptr->pchan = rpar.pchan;
        __ptr->nblks = rpar.bufsz / rpar.round;
        __ptr->data_cb = data_callback;
        __ptr->state_cb = state_callback;
        __ptr->arg = user_ptr;
        (__ptr->mtx).__data.__list.__next = (__pthread_internal_list *)0x0;
        __ptr->hwpos = 0;
        __ptr->swpos = 0;
        (__ptr->mtx).__align = 0;
        *(undefined8 *)((long)&__ptr->mtx + 8) = 0;
        uVar10 = 4;
        if (cVar1 != CUBEB_SAMPLE_FLOAT32LE) {
          uVar10 = (ulong)rpar.bps;
        }
        *(undefined8 *)((long)&__ptr->mtx + 0x10) = 0;
        (__ptr->mtx).__data.__list.__prev = (__pthread_internal_list *)0x0;
        __ptr->conv = (uint)((ulong)cVar1 == 2);
        uVar9 = __ptr->mode;
        if ((uVar9 & 1) != 0) {
          puVar8 = (uchar *)malloc((ulong)rpar.pchan * (ulong)rpar.round * uVar10);
          __ptr->pbuf = puVar8;
          if (puVar8 == (uchar *)0x0) goto LAB_001218f1;
        }
        if ((uVar9 & 2) != 0) {
          puVar8 = (uchar *)malloc((ulong)rpar.rchan * (ulong)rpar.round * uVar10);
          __ptr->rbuf = puVar8;
          if (puVar8 == (uchar *)0x0) goto LAB_001218f1;
        }
        __ptr->volume = 1.0;
        *stream = __ptr;
        return 0;
      }
    }
  }
LAB_001218f1:
  if (__ptr->hdl != (sio_hdl *)0x0) {
    (*cubeb_sio_close)(__ptr->hdl);
  }
  free(__ptr->pbuf);
  if (__ptr->rbuf != (uchar *)0x0) {
    free(__ptr->pbuf);
  }
  free(__ptr);
  return -1;
}

Assistant:

static int
sndio_stream_init(cubeb * context,
                  cubeb_stream ** stream,
                  char const * stream_name,
                  cubeb_devid input_device,
                  cubeb_stream_params * input_stream_params,
                  cubeb_devid output_device,
                  cubeb_stream_params * output_stream_params,
                  unsigned int latency_frames,
                  cubeb_data_callback data_callback,
                  cubeb_state_callback state_callback,
                  void *user_ptr)
{
  cubeb_stream *s;
  struct sio_par wpar, rpar;
  cubeb_sample_format format;
  int rate;
  size_t bps;

  DPR("sndio_stream_init(%s)\n", stream_name);

  s = malloc(sizeof(cubeb_stream));
  if (s == NULL)
    return CUBEB_ERROR;
  memset(s, 0, sizeof(cubeb_stream));
  s->mode = 0;
  if (input_stream_params) {
    if (input_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_REC;
    format = input_stream_params->format;
    rate = input_stream_params->rate;
  }
  if (output_stream_params) {
    if (output_stream_params->prefs & CUBEB_STREAM_PREF_LOOPBACK) {
      DPR("sndio_stream_init(), loopback not supported\n");
      goto err;
    }
    s->mode |= SIO_PLAY;
    format = output_stream_params->format;
    rate = output_stream_params->rate;
  }
  if (s->mode == 0) {
    DPR("sndio_stream_init(), neither playing nor recording\n");
    goto err;
  }
  s->context = context;
  s->hdl = WRAP(sio_open)(sndio_get_device(), s->mode, 1);
  if (s->hdl == NULL) {
    DPR("sndio_stream_init(), sio_open() failed\n");
    goto err;
  }
  WRAP(sio_initpar)(&wpar);
  wpar.sig = 1;
  wpar.bits = 16;
  switch (format) {
  case CUBEB_SAMPLE_S16LE:
    wpar.le = 1;
    break;
  case CUBEB_SAMPLE_S16BE:
    wpar.le = 0;
    break;
  case CUBEB_SAMPLE_FLOAT32NE:
    wpar.le = SIO_LE_NATIVE;
    break;
  default:
    DPR("sndio_stream_init() unsupported format\n");
    goto err;
  }
  wpar.rate = rate;
  if (s->mode & SIO_REC)
    wpar.rchan = input_stream_params->channels;
  if (s->mode & SIO_PLAY)
    wpar.pchan = output_stream_params->channels;
  wpar.appbufsz = latency_frames;
  if (!WRAP(sio_setpar)(s->hdl, &wpar) || !WRAP(sio_getpar)(s->hdl, &rpar)) {
    DPR("sndio_stream_init(), sio_setpar() failed\n");
    goto err;
  }
  if (rpar.bits != wpar.bits || rpar.le != wpar.le ||
      rpar.sig != wpar.sig || rpar.rate != wpar.rate ||
      ((s->mode & SIO_REC) && rpar.rchan != wpar.rchan) ||
      ((s->mode & SIO_PLAY) && rpar.pchan != wpar.pchan)) {
    DPR("sndio_stream_init() unsupported params\n");
    goto err;
  }
  WRAP(sio_onmove)(s->hdl, sndio_onmove, s);
  s->active = 0;
  s->nfr = rpar.round;
  s->rbpf = rpar.bps * rpar.rchan;
  s->pbpf = rpar.bps * rpar.pchan;
  s->rchan = rpar.rchan;
  s->pchan = rpar.pchan;
  s->nblks = rpar.bufsz / rpar.round;
  s->data_cb = data_callback;
  s->state_cb = state_callback;
  s->arg = user_ptr;
  s->mtx = (pthread_mutex_t)PTHREAD_MUTEX_INITIALIZER;
  s->hwpos = s->swpos = 0;
  if (format == CUBEB_SAMPLE_FLOAT32LE) {
    s->conv = 1;
    bps = sizeof(float);
  } else {
    s->conv = 0;
    bps = rpar.bps;
  }
  if (s->mode & SIO_PLAY) {
    s->pbuf = malloc(bps * rpar.pchan * rpar.round);
    if (s->pbuf == NULL)
      goto err;
  }
  if (s->mode & SIO_REC) {
    s->rbuf = malloc(bps * rpar.rchan * rpar.round);
    if (s->rbuf == NULL)
      goto err;
  }
  s->volume = 1.;
  *stream = s;
  DPR("sndio_stream_init() end, ok\n");
  (void)context;
  (void)stream_name;
  return CUBEB_OK;
err:
  if (s->hdl)
    WRAP(sio_close)(s->hdl);
  if (s->pbuf)
    free(s->pbuf);
  if (s->rbuf)
    free(s->pbuf);
  free(s);
  return CUBEB_ERROR;
}